

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzDD::ChNodeFEAxyzDD
          (ChNodeFEAxyzDD *this,ChVector<double> *initial_pos,ChVector<double> *initial_dir,
          ChVector<double> *initial_curv)

{
  double dVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  ChVariablesGenericDiagonalMass *this_00;
  undefined1 auVar4 [16];
  ChVector<double> local_58;
  ChVector<double> local_38;
  undefined1 auVar5 [32];
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x188);
  *(undefined ***)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x18 =
       &PTR__ChLoadable_011504f8;
  local_38.m_data[0] = initial_pos->m_data[0];
  local_38.m_data[1] = initial_pos->m_data[1];
  local_38.m_data[2] = initial_pos->m_data[2];
  local_58.m_data[0] = initial_dir->m_data[0];
  local_58.m_data[1] = initial_dir->m_data[1];
  local_58.m_data[2] = initial_dir->m_data[2];
  ChNodeFEAxyzD::ChNodeFEAxyzD
            (&this->super_ChNodeFEAxyzD,&PTR_construction_vtable_32__0117a608,&local_38,&local_58);
  (this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase =
       (_func_int **)0x117a1b0;
  *(undefined8 *)&this->field_0x188 = 0x117a548;
  *(undefined8 *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x18 =
       0x117a3a8;
  (this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChVariableTupleCarrier_1vars<3>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x2e0);
  *(double *)&(this->super_ChNodeFEAxyzD).field_0x140 = initial_curv->m_data[0];
  *(double *)&this->field_0x148 = initial_curv->m_data[1];
  auVar3 = _VNULL;
  auVar4._8_8_ = DAT_011dd3e8;
  auVar4._0_8_ = DAT_011dd3e8;
  auVar5._16_8_ = DAT_011dd3e8;
  auVar5._0_16_ = auVar4;
  auVar5._24_8_ = DAT_011dd3e8;
  auVar2 = vpermpd_avx2(ZEXT1632(_VNULL),0xd0);
  auVar2 = vblendps_avx(auVar2,ZEXT832((ulong)initial_curv->m_data[2]),3);
  auVar2 = vblendps_avx(auVar2,auVar5,0xc0);
  *(undefined1 (*) [32])&this->field_0x150 = auVar2;
  *(undefined1 (*) [16])(this->DD_dtdt).m_data = auVar3;
  dVar1 = (double)vmovlps_avx(auVar4);
  (this->DD_dtdt).m_data[2] = dVar1;
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,3);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAxyzD).field_0x138 = this_00;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this_00->MmassDiag);
  return;
}

Assistant:

ChNodeFEAxyzDD::ChNodeFEAxyzDD(ChVector<> initial_pos, ChVector<> initial_dir, ChVector<> initial_curv)
    : ChNodeFEAxyzD(initial_pos, initial_dir), DD(initial_curv), DD_dt(VNULL), DD_dtdt(VNULL) {
    variables_DD = new ChVariablesGenericDiagonalMass(3);
    // default: no atomic mass associated to fea node, the fea element will add mass matrix
    variables_DD->GetMassDiagonal().setZero();
}